

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_async_from_sync_iterator_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue *pJVar1;
  
  if ((((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x30)) &&
     (pJVar1 = *(JSValue **)((long)val.u.ptr + 0x30), pJVar1 != (JSValue *)0x0)) {
    JS_FreeValueRT(rt,*pJVar1);
    JS_FreeValueRT(rt,pJVar1[1]);
    (*(rt->mf).js_free)(&rt->malloc_state,pJVar1);
    return;
  }
  return;
}

Assistant:

static void js_async_from_sync_iterator_finalizer(JSRuntime *rt, JSValue val)
{
    JSAsyncFromSyncIteratorData *s =
        JS_GetOpaque(val, JS_CLASS_ASYNC_FROM_SYNC_ITERATOR);
    if (s) {
        JS_FreeValueRT(rt, s->sync_iter);
        JS_FreeValueRT(rt, s->next_method);
        js_free_rt(rt, s);
    }
}